

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

Test * __thiscall
testing::internal::TestFactoryImpl<(anonymous_namespace)::ktxTexture1WriteKTX2TestRGB8_3D_Test>::
CreateTest(TestFactoryImpl<(anonymous_namespace)::ktxTexture1WriteKTX2TestRGB8_3D_Test> *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x188);
  anon_unknown.dwarf_c633::ktxTexture1WriteKTX2TestRGB8_3D_Test::
  ktxTexture1WriteKTX2TestRGB8_3D_Test((ktxTexture1WriteKTX2TestRGB8_3D_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }